

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall tinyxml2::XMLElement::ParseAttributes(XMLElement *this,char *p,int *curLineNumPtr)

{
  XMLError error;
  bool bVar1;
  uchar *p_00;
  XMLAttribute *this_00;
  char *pcVar2;
  XMLAttribute **ppXVar3;
  XMLAttribute *pXVar4;
  int lineNum;
  XMLDocument *pXVar5;
  
  pXVar4 = (XMLAttribute *)0x0;
  while( true ) {
    if (p == (char *)0x0) {
      return (char *)0x0;
    }
    p_00 = (uchar *)XMLUtil::SkipWhiteSpace(p,curLineNumPtr);
    if (*p_00 == '\0') {
      pXVar5 = (this->super_XMLNode)._document;
      lineNum = (this->super_XMLNode)._parseLineNum;
      pcVar2 = XMLNode::Value(&this->super_XMLNode);
      error = XML_ERROR_PARSING_ELEMENT;
      goto LAB_001140d0;
    }
    bVar1 = XMLUtil::IsNameStartChar(*p_00);
    if (!bVar1) {
      if (*p_00 == '/') {
        if (p_00[1] == '>') {
          this->_closingType = CLOSED;
          return (char *)(p_00 + 2);
        }
      }
      else if (*p_00 == '>') {
        return (char *)(p_00 + 1);
      }
      XMLDocument::SetError
                ((this->super_XMLNode)._document,XML_ERROR_PARSING_ELEMENT,
                 (this->super_XMLNode)._parseLineNum,(char *)0x0);
      return (char *)0x0;
    }
    this_00 = CreateAttribute(this);
    pXVar5 = (this->super_XMLNode)._document;
    lineNum = pXVar5->_parseCurLineNum;
    this_00->_parseLineNum = lineNum;
    p = XMLAttribute::ParseDeep(this_00,(char *)p_00,pXVar5->_processEntities,curLineNumPtr);
    if (p == (char *)0x0) break;
    pcVar2 = StrPair::GetStr(&this_00->_name);
    pcVar2 = Attribute(this,pcVar2,(char *)0x0);
    if (pcVar2 != (char *)0x0) break;
    ppXVar3 = &pXVar4->_next;
    if (pXVar4 == (XMLAttribute *)0x0) {
      ppXVar3 = &this->_rootAttribute;
    }
    *ppXVar3 = this_00;
    pXVar4 = this_00;
  }
  DeleteAttribute(this_00);
  pXVar5 = (this->super_XMLNode)._document;
  pcVar2 = XMLNode::Value(&this->super_XMLNode);
  error = XML_ERROR_PARSING_ATTRIBUTE;
LAB_001140d0:
  XMLDocument::SetError(pXVar5,error,lineNum,"XMLElement name=%s",pcVar2);
  return (char *)0x0;
}

Assistant:

char* XMLElement::ParseAttributes( char* p, int* curLineNumPtr )
{
    XMLAttribute* prevAttribute = 0;

    // Read the attributes.
    while( p ) {
        p = XMLUtil::SkipWhiteSpace( p, curLineNumPtr );
        if ( !(*p) ) {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, _parseLineNum, "XMLElement name=%s", Name() );
            return 0;
        }

        // attribute.
        if (XMLUtil::IsNameStartChar( (unsigned char) *p ) ) {
            XMLAttribute* attrib = CreateAttribute();
            TIXMLASSERT( attrib );
            attrib->_parseLineNum = _document->_parseCurLineNum;

            const int attrLineNum = attrib->_parseLineNum;

            p = attrib->ParseDeep( p, _document->ProcessEntities(), curLineNumPtr );
            if ( !p || Attribute( attrib->Name() ) ) {
                DeleteAttribute( attrib );
                _document->SetError( XML_ERROR_PARSING_ATTRIBUTE, attrLineNum, "XMLElement name=%s", Name() );
                return 0;
            }
            // There is a minor bug here: if the attribute in the source xml
            // document is duplicated, it will not be detected and the
            // attribute will be doubly added. However, tracking the 'prevAttribute'
            // avoids re-scanning the attribute list. Preferring performance for
            // now, may reconsider in the future.
            if ( prevAttribute ) {
                TIXMLASSERT( prevAttribute->_next == 0 );
                prevAttribute->_next = attrib;
            }
            else {
                TIXMLASSERT( _rootAttribute == 0 );
                _rootAttribute = attrib;
            }
            prevAttribute = attrib;
        }
        // end of the tag
        else if ( *p == '>' ) {
            ++p;
            break;
        }
        // end of the tag
        else if ( *p == '/' && *(p+1) == '>' ) {
            _closingType = CLOSED;
            return p+2;	// done; sealed element.
        }
        else {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, _parseLineNum, 0 );
            return 0;
        }
    }
    return p;
}